

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ieee.cc
# Opt level: O2

void TestDouble_NormalizedBoundaries(void)

{
  uint64_t uVar1;
  long lVar2;
  ulong uVar3;
  int in_R9D;
  DiyFp DVar4;
  Double local_58;
  DiyFp boundary_minus;
  DiyFp boundary_plus;
  
  boundary_plus.f_ = 0;
  boundary_plus.e_ = 0;
  boundary_minus.f_ = 0;
  boundary_minus.e_ = 0;
  local_58.d64_ = 0x3ff8000000000000;
  DVar4 = double_conversion::Double::AsNormalizedDiyFp(&local_58);
  uVar1 = DVar4.f_;
  local_58.d64_ = 0x3ff8000000000000;
  double_conversion::Double::NormalizedBoundaries(&local_58,&boundary_minus,&boundary_plus);
  CheckEqualsHelper((char *)0x114,0xc1c1f6,(char *)(ulong)(uint)DVar4.e_,0xc1cda8,
                    (char *)(ulong)(uint)boundary_minus.e_,in_R9D);
  CheckEqualsHelper((char *)0x115,0xc1c1f6,(char *)(ulong)(uint)DVar4.e_,0xc1cdbb,
                    (char *)(ulong)(uint)boundary_plus.e_,in_R9D);
  lVar2 = boundary_plus.f_ - uVar1;
  CheckHelper((char *)0x118,0xc1cdcd,(char *)(ulong)(uVar1 - boundary_minus.f_ == lVar2),
              SUB81(lVar2,0));
  CheckHelper((char *)0x119,0xc1ce0f,(char *)(ulong)(uVar1 - boundary_minus.f_ == 0x400),
              SUB81(lVar2,0));
  local_58.d64_ = 0x3ff0000000000000;
  DVar4 = double_conversion::Double::AsNormalizedDiyFp(&local_58);
  uVar1 = DVar4.f_;
  local_58.d64_ = 0x3ff0000000000000;
  double_conversion::Double::NormalizedBoundaries(&local_58,&boundary_minus,&boundary_plus);
  CheckEqualsHelper((char *)0x11d,0xc1c1f6,(char *)(ulong)(uint)DVar4.e_,0xc1cda8,
                    (char *)(ulong)(uint)boundary_minus.e_,in_R9D);
  CheckEqualsHelper((char *)0x11e,0xc1c1f6,(char *)(ulong)(uint)DVar4.e_,0xc1cdbb,
                    (char *)(ulong)(uint)boundary_plus.e_,in_R9D);
  uVar3 = uVar1 - boundary_minus.f_;
  CheckHelper((char *)0x121,0xc1ce3c,(char *)(ulong)(uVar3 < boundary_plus.f_ - uVar1),
              SUB81(uVar3,0));
  CheckHelper((char *)0x122,0xc1ce7d,(char *)(ulong)(uVar1 - boundary_minus.f_ == 0x200),
              SUB81(uVar3,0));
  CheckHelper((char *)0x123,0xc1cea9,(char *)(ulong)(boundary_plus.f_ - uVar1 == 0x400),false);
  local_58.d64_ = 1;
  DVar4 = double_conversion::Double::AsNormalizedDiyFp(&local_58);
  uVar1 = DVar4.f_;
  local_58.d64_ = 1;
  double_conversion::Double::NormalizedBoundaries(&local_58,&boundary_minus,&boundary_plus);
  CheckEqualsHelper((char *)0x128,0xc1c1f6,(char *)(ulong)(uint)DVar4.e_,0xc1cda8,
                    (char *)(ulong)(uint)boundary_minus.e_,in_R9D);
  CheckEqualsHelper((char *)0x129,0xc1c1f6,(char *)(ulong)(uint)DVar4.e_,0xc1cdbb,
                    (char *)(ulong)(uint)boundary_plus.e_,in_R9D);
  lVar2 = boundary_plus.f_ - uVar1;
  CheckHelper((char *)0x12c,0xc1cdcd,(char *)(ulong)(uVar1 - boundary_minus.f_ == lVar2),
              SUB81(lVar2,0));
  CheckHelper((char *)0x12f,0xc1ced5,
              (char *)(ulong)(uVar1 - boundary_minus.f_ == 0x4000000000000000),SUB81(lVar2,0));
  local_58.d64_ = 0x10000000000000;
  DVar4 = double_conversion::Double::AsNormalizedDiyFp(&local_58);
  uVar1 = DVar4.f_;
  local_58.d64_ = 0x10000000000000;
  double_conversion::Double::NormalizedBoundaries(&local_58,&boundary_minus,&boundary_plus);
  CheckEqualsHelper((char *)0x135,0xc1c1f6,(char *)(ulong)(uint)DVar4.e_,0xc1cda8,
                    (char *)(ulong)(uint)boundary_minus.e_,in_R9D);
  CheckEqualsHelper((char *)0x136,0xc1c1f6,(char *)(ulong)(uint)DVar4.e_,0xc1cdbb,
                    (char *)(ulong)(uint)boundary_plus.e_,in_R9D);
  lVar2 = boundary_plus.f_ - uVar1;
  CheckHelper((char *)0x139,0xc1cdcd,(char *)(ulong)(uVar1 - boundary_minus.f_ == lVar2),
              SUB81(lVar2,0));
  CheckHelper((char *)0x13a,0xc1ce0f,(char *)(ulong)(uVar1 - boundary_minus.f_ == 0x400),
              SUB81(lVar2,0));
  local_58.d64_ = 0xfffffffffffff;
  DVar4 = double_conversion::Double::AsNormalizedDiyFp(&local_58);
  uVar1 = DVar4.f_;
  local_58.d64_ = 0xfffffffffffff;
  double_conversion::Double::NormalizedBoundaries(&local_58,&boundary_minus,&boundary_plus);
  CheckEqualsHelper((char *)0x140,0xc1c1f6,(char *)(ulong)(uint)DVar4.e_,0xc1cda8,
                    (char *)(ulong)(uint)boundary_minus.e_,in_R9D);
  CheckEqualsHelper((char *)0x141,0xc1c1f6,(char *)(ulong)(uint)DVar4.e_,0xc1cdbb,
                    (char *)(ulong)(uint)boundary_plus.e_,in_R9D);
  lVar2 = boundary_plus.f_ - uVar1;
  CheckHelper((char *)0x142,0xc1cdcd,(char *)(ulong)(uVar1 - boundary_minus.f_ == lVar2),
              SUB81(lVar2,0));
  CheckHelper((char *)0x143,0xc1cf19,(char *)(ulong)(uVar1 - boundary_minus.f_ == 0x800),
              SUB81(lVar2,0));
  local_58.d64_ = 0x7fefffffffffffff;
  DVar4 = double_conversion::Double::AsNormalizedDiyFp(&local_58);
  uVar1 = DVar4.f_;
  local_58.d64_ = 0x7fefffffffffffff;
  double_conversion::Double::NormalizedBoundaries(&local_58,&boundary_minus,&boundary_plus);
  CheckEqualsHelper((char *)0x148,0xc1c1f6,(char *)(ulong)(uint)DVar4.e_,0xc1cda8,
                    (char *)(ulong)(uint)boundary_minus.e_,in_R9D);
  CheckEqualsHelper((char *)0x149,0xc1c1f6,(char *)(ulong)(uint)DVar4.e_,0xc1cdbb,
                    (char *)(ulong)(uint)boundary_plus.e_,in_R9D);
  lVar2 = boundary_plus.f_ - uVar1;
  CheckHelper((char *)0x14c,0xc1cdcd,(char *)(ulong)(uVar1 - boundary_minus.f_ == lVar2),
              SUB81(lVar2,0));
  CheckHelper((char *)0x14d,0xc1ce0f,(char *)(ulong)(uVar1 - boundary_minus.f_ == 0x400),
              SUB81(lVar2,0));
  return;
}

Assistant:

TEST(Double_NormalizedBoundaries) {
  DiyFp boundary_plus;
  DiyFp boundary_minus;
  DiyFp diy_fp = Double(1.5).AsNormalizedDiyFp();
  Double(1.5).NormalizedBoundaries(&boundary_minus, &boundary_plus);
  CHECK_EQ(diy_fp.e(), boundary_minus.e());
  CHECK_EQ(diy_fp.e(), boundary_plus.e());
  // 1.5 does not have a significand of the form 2^p (for some p).
  // Therefore its boundaries are at the same distance.
  CHECK(diy_fp.f() - boundary_minus.f() == boundary_plus.f() - diy_fp.f());
  CHECK((1 << 10) == diy_fp.f() - boundary_minus.f());  // NOLINT

  diy_fp = Double(1.0).AsNormalizedDiyFp();
  Double(1.0).NormalizedBoundaries(&boundary_minus, &boundary_plus);
  CHECK_EQ(diy_fp.e(), boundary_minus.e());
  CHECK_EQ(diy_fp.e(), boundary_plus.e());
  // 1.0 does have a significand of the form 2^p (for some p).
  // Therefore its lower boundary is twice as close as the upper boundary.
  CHECK(boundary_plus.f() - diy_fp.f() > diy_fp.f() - boundary_minus.f());
  CHECK((1 << 9) == diy_fp.f() - boundary_minus.f());  // NOLINT
  CHECK((1 << 10) == boundary_plus.f() - diy_fp.f());  // NOLINT

  uint64_t min_double64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x00000000, 00000001);
  diy_fp = Double(min_double64).AsNormalizedDiyFp();
  Double(min_double64).NormalizedBoundaries(&boundary_minus, &boundary_plus);
  CHECK_EQ(diy_fp.e(), boundary_minus.e());
  CHECK_EQ(diy_fp.e(), boundary_plus.e());
  // min-value does not have a significand of the form 2^p (for some p).
  // Therefore its boundaries are at the same distance.
  CHECK(diy_fp.f() - boundary_minus.f() == boundary_plus.f() - diy_fp.f());
  // Denormals have their boundaries much closer.
  CHECK((static_cast<uint64_t>(1) << 62) ==
        diy_fp.f() - boundary_minus.f());  // NOLINT

  uint64_t smallest_normal64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x00100000, 00000000);
  diy_fp = Double(smallest_normal64).AsNormalizedDiyFp();
  Double(smallest_normal64).NormalizedBoundaries(&boundary_minus,
                                                 &boundary_plus);
  CHECK_EQ(diy_fp.e(), boundary_minus.e());
  CHECK_EQ(diy_fp.e(), boundary_plus.e());
  // Even though the significand is of the form 2^p (for some p), its boundaries
  // are at the same distance. (This is the only exception).
  CHECK(diy_fp.f() - boundary_minus.f() == boundary_plus.f() - diy_fp.f());
  CHECK((1 << 10) == diy_fp.f() - boundary_minus.f());  // NOLINT

  uint64_t largest_denormal64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x000FFFFF, FFFFFFFF);
  diy_fp = Double(largest_denormal64).AsNormalizedDiyFp();
  Double(largest_denormal64).NormalizedBoundaries(&boundary_minus,
                                                  &boundary_plus);
  CHECK_EQ(diy_fp.e(), boundary_minus.e());
  CHECK_EQ(diy_fp.e(), boundary_plus.e());
  CHECK(diy_fp.f() - boundary_minus.f() == boundary_plus.f() - diy_fp.f());
  CHECK((1 << 11) == diy_fp.f() - boundary_minus.f());  // NOLINT

  uint64_t max_double64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x7fefffff, ffffffff);
  diy_fp = Double(max_double64).AsNormalizedDiyFp();
  Double(max_double64).NormalizedBoundaries(&boundary_minus, &boundary_plus);
  CHECK_EQ(diy_fp.e(), boundary_minus.e());
  CHECK_EQ(diy_fp.e(), boundary_plus.e());
  // max-value does not have a significand of the form 2^p (for some p).
  // Therefore its boundaries are at the same distance.
  CHECK(diy_fp.f() - boundary_minus.f() == boundary_plus.f() - diy_fp.f());
  CHECK((1 << 10) == diy_fp.f() - boundary_minus.f());  // NOLINT
}